

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::resize(Application *this,size_t w,size_t h)

{
  this->screenW = w;
  this->screenH = h;
  Camera::set_screen_size(&this->camera,w,h);
  OSDText::resize(&this->textManager,w,h);
  set_projection_matrix(this);
  if (*(int *)&(this->super_Renderer).field_0xc != 0) {
    PathTracer::set_frame_size(this->pathtracer,w,h);
  }
  Timeline::resize(&this->timeline,(int)w,0x40);
  Timeline::move(&this->timeline,0,(int)h + -0x40);
  (*__glewBindFramebuffer)(0x8d40,this->backface_fbo);
  glBindTexture(0xde1,this->backface_color_tex);
  glTexImage2D(0xde1,0,0x8058,(int)this->screenW,(int)this->screenH,0,0x80e1,0x1401,0);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glBindTexture(0xde1,this->backface_depth_tex);
  glTexImage2D(0xde1,0,0x81a6,(int)this->screenW,(int)this->screenH,0,0x1902,0x1401,0);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x884b,0x8049);
  glTexParameteri(0xde1,0x884c,0x884e);
  glTexParameteri(0xde1,0x884d,0x203);
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,this->backface_color_tex,0);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,this->backface_depth_tex,0);
  (*__glewBindFramebuffer)(0x8d40,this->frntface_fbo);
  glBindTexture(0xde1,this->frntface_color_tex);
  glTexImage2D(0xde1,0,0x8058,(int)this->screenW,(int)this->screenH,0,0x80e1,0x1401,0);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glBindTexture(0xde1,this->frntface_depth_tex);
  glTexImage2D(0xde1,0,0x81a6,(int)this->screenW,(int)this->screenH,0,0x1902,0x1401,0);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2600);
  glTexParameteri(0xde1,0x884b,0x8049);
  glTexParameteri(0xde1,0x884c,0x884e);
  glTexParameteri(0xde1,0x884d,0x203);
  (*__glewFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,this->frntface_color_tex,0);
  (*__glewFramebufferTexture2D)(0x8d40,0x8d00,0xde1,this->frntface_depth_tex,0);
  (*__glewBindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void Application::resize(size_t w, size_t h) {
  screenW = w;
  screenH = h;
  camera.set_screen_size(w, h);
  textManager.resize(w, h);
  set_projection_matrix();
  if (mode != MODEL_MODE) {
    pathtracer->set_frame_size(w, h);
  }
  timeline.resize(w, 64);
  timeline.move(0, h - 64);

  auto set_params = [](bool depth) {
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    if(depth) {
      glTexParameteri(GL_TEXTURE_2D, GL_DEPTH_TEXTURE_MODE, GL_INTENSITY);
      glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_R_TO_TEXTURE);
      glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LEQUAL);
    }
  };

  // update backface fbo texture
  glBindFramebuffer(GL_FRAMEBUFFER, backface_fbo);
  glBindTexture(GL_TEXTURE_2D, backface_color_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_RGBA8, screenW, screenH, 0, GL_BGRA, GL_UNSIGNED_BYTE, NULL);
  set_params(false);
  glBindTexture(GL_TEXTURE_2D, backface_depth_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT24, screenW, screenH, 0, GL_DEPTH_COMPONENT, GL_UNSIGNED_BYTE, NULL);
  set_params(true);

  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, backface_color_tex, 0
  );
  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, backface_depth_tex, 0
  );


  // update frontface fbo texture
  glBindFramebuffer(GL_FRAMEBUFFER, frntface_fbo);
  glBindTexture(GL_TEXTURE_2D, frntface_color_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_RGBA8, screenW, screenH, 0, GL_BGRA, GL_UNSIGNED_BYTE, NULL);
  set_params(false);
  glBindTexture(GL_TEXTURE_2D, frntface_depth_tex);
  glTexImage2D (GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT24, screenW, screenH, 0, GL_DEPTH_COMPONENT, GL_UNSIGNED_BYTE, NULL);
  set_params(true);

  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, frntface_color_tex, 0
  );
  glFramebufferTexture2D(
    GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, frntface_depth_tex, 0
  );
  glBindFramebuffer(GL_FRAMEBUFFER, 0);
}